

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O1

void Ssw_SmlSimulateOneFrame(Ssw_Sml_t *p)

{
  Aig_Obj_t *pObj;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Aig_Man_t *pAVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  timespec ts;
  timespec local_30;
  
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  pVVar2 = p->pAig->vObjs;
  if (0 < pVVar2->nSize) {
    lVar7 = 0;
    do {
      pObj = (Aig_Obj_t *)pVVar2->pArray[lVar7];
      if ((pObj != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7)) {
        Ssw_SmlNodeSimulate(p,pObj,0);
      }
      lVar7 = lVar7 + 1;
      pVVar2 = p->pAig->vObjs;
    } while (lVar7 < pVVar2->nSize);
  }
  pAVar3 = p->pAig;
  if (0 < pAVar3->nRegs) {
    iVar1 = 0;
    do {
      uVar4 = pAVar3->nTruePos + iVar1;
      if (((int)uVar4 < 0) || (pAVar3->vCos->nSize <= (int)uVar4)) goto LAB_005f0eef;
      Ssw_SmlNodeCopyFanin(p,(Aig_Obj_t *)pAVar3->vCos->pArray[uVar4],0);
      iVar1 = iVar1 + 1;
      pAVar3 = p->pAig;
    } while (iVar1 < pAVar3->nRegs);
  }
  pAVar3 = p->pAig;
  if (0 < pAVar3->nRegs) {
    iVar1 = 0;
    do {
      uVar4 = pAVar3->nTruePos + iVar1;
      if (((((int)uVar4 < 0) || (pAVar3->vCos->nSize <= (int)uVar4)) ||
          (uVar6 = pAVar3->nTruePis + iVar1, (int)uVar6 < 0)) || (pAVar3->vCis->nSize <= (int)uVar6)
         ) {
LAB_005f0eef:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Ssw_SmlNodeTransferNext
                (p,(Aig_Obj_t *)pAVar3->vCos->pArray[uVar4],(Aig_Obj_t *)pAVar3->vCis->pArray[uVar6]
                 ,0);
      iVar1 = iVar1 + 1;
      pAVar3 = p->pAig;
    } while (iVar1 < pAVar3->nRegs);
  }
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  p->timeSim = p->timeSim + lVar7 + lVar5;
  p->nSimRounds = p->nSimRounds + 1;
  return;
}

Assistant:

void Ssw_SmlSimulateOneFrame( Ssw_Sml_t * p )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
    abctime clk;
clk = Abc_Clock();
    // simulate the nodes
    Aig_ManForEachNode( p->pAig, pObj, i )
        Ssw_SmlNodeSimulate( p, pObj, 0 );
    // copy simulation info into outputs
    Saig_ManForEachLi( p->pAig, pObj, i )
        Ssw_SmlNodeCopyFanin( p, pObj, 0 );
    // copy simulation info into the inputs
    Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        Ssw_SmlNodeTransferNext( p, pObjLi, pObjLo, 0 );
p->timeSim += Abc_Clock() - clk;
p->nSimRounds++;
}